

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<char_const(&)[25],unsigned_short_const&,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,char (*params) [25],unsigned_short *params_1,
          char (*params_2) [2])

{
  CappedArray<char,_8UL> local_58;
  CappedArray<char,_8UL> local_48;
  kj *local_38;
  size_t local_30;
  
  local_30 = strlen((char *)this);
  local_38 = this;
  local_48 = _::Stringifier::operator*((Stringifier *)&_::STR,*(unsigned_short *)*params);
  local_58.content = (char  [8])strlen((char *)params_1);
  local_58.currentSize = (size_t)params_1;
  _::concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_38,(ArrayPtr<const_char> *)&local_48,&local_58,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}